

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

u32string *
anon_unknown.dwarf_ec6a::codecvt_u16_to_u32(u32string *__return_storage_ptr__,u16string *u16)

{
  string u8;
  string local_30;
  
  codecvt_u16_to_u8(&local_30,u16);
  codecvt_u8_to_u32(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline
u32string codecvt_u16_to_u32(const u16string& u16)
{
    // You might expect std::codecvt_utf16<char32_t> to convert between
    // char16_t and char32_t, but it does not; rather, it operates on
    // UTF-16 encoded *byte* strings. This is not what we want.
    // We could try to reinterpret_cast<> our way around the problem, but this
    // is ugly and error prone. The easiest way is to do the conversion in two
    // steps, to UTF-8 and then to UTF-32. While this might be "unfair" on
    // codecvt for benchmark purposes, it does rather demonstrate what a
    // terrible API it is.
    const string u8 = codecvt_u16_to_u8(u16);
    return codecvt_u8_to_u32(u8);
}